

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx::
     BVHNIntersectorKHybrid<8,_8,_1,_false,_embree::avx::ArrayIntersectorK_1<8,_embree::avx::QuadMvIntersectorKMoeller<4,_8,_false>_>,_true>
     ::intersect(vint<8> *valid_i,Intersectors *This,RayHitK<8> *ray,RayQueryContext *context)

{
  BVH *bvh;
  size_t k;
  undefined1 auVar1 [32];
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  ulong uVar13;
  undefined1 auVar14 [32];
  undefined1 in_ZMM0 [64];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  Precalculations pre;
  TravRayK<8,_false> tray;
  Precalculations local_231;
  RayHitK<8> *local_230;
  Intersectors *local_228;
  anon_union_96_2_4062524c_for_Vec3<embree::vfloat_impl<8>_>_1 local_220;
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  
  bvh = (BVH *)This->ptr;
  if ((bvh->root).ptr != 8) {
    local_230 = ray;
    local_228 = This;
    if ((context->user == (RTCRayQueryContext *)0x0) ||
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) == RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      auVar9 = vpcmpeqd_avx(in_ZMM0._0_16_,in_ZMM0._0_16_);
      auVar10 = vpcmpeqd_avx(auVar9,*(undefined1 (*) [16])(valid_i->field_0).field_1.vl);
      auVar9 = vpcmpeqd_avx(auVar9,*(undefined1 (*) [16])((long)&valid_i->field_0 + 0x10));
      auVar9 = vpackssdw_avx(auVar10,auVar9);
      if ((((((((((((((((auVar9 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                       (auVar9 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar9 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar9 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar9 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar9 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar9 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar9 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar9 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar9 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar9 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar9 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar9 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           (auVar9 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar9 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar9[0xf] < '\0')
      {
        auVar10 = vpacksswb_avx(auVar9,auVar9);
        local_220._0_8_ = *(undefined8 *)ray;
        local_220._8_8_ = *(undefined8 *)(ray + 8);
        local_220._16_8_ = *(undefined8 *)(ray + 0x10);
        local_220._24_8_ = *(undefined8 *)(ray + 0x18);
        local_220._32_8_ = *(undefined8 *)(ray + 0x20);
        local_220._40_8_ = *(undefined8 *)(ray + 0x28);
        local_220._48_8_ = *(undefined8 *)(ray + 0x30);
        local_220._56_8_ = *(undefined8 *)(ray + 0x38);
        local_220._64_8_ = *(undefined8 *)(ray + 0x40);
        local_220._72_8_ = *(undefined8 *)(ray + 0x48);
        local_220._80_8_ = *(undefined8 *)(ray + 0x50);
        local_220._88_8_ = *(undefined8 *)(ray + 0x58);
        local_1c0 = *(undefined1 (*) [32])(ray + 0x80);
        local_1a0 = *(undefined1 (*) [32])(ray + 0xa0);
        local_180 = *(undefined1 (*) [32])(ray + 0xc0);
        auVar19._8_4_ = 0x7fffffff;
        auVar19._0_8_ = 0x7fffffff7fffffff;
        auVar19._12_4_ = 0x7fffffff;
        auVar19._16_4_ = 0x7fffffff;
        auVar19._20_4_ = 0x7fffffff;
        auVar19._24_4_ = 0x7fffffff;
        auVar19._28_4_ = 0x7fffffff;
        auVar21._8_4_ = 0x219392ef;
        auVar21._0_8_ = 0x219392ef219392ef;
        auVar21._12_4_ = 0x219392ef;
        auVar21._16_4_ = 0x219392ef;
        auVar21._20_4_ = 0x219392ef;
        auVar21._24_4_ = 0x219392ef;
        auVar21._28_4_ = 0x219392ef;
        auVar1 = vandps_avx(local_1c0,auVar19);
        auVar1 = vcmpps_avx(auVar1,auVar21,1);
        auVar20 = vblendvps_avx(local_1c0,auVar21,auVar1);
        auVar1 = vandps_avx(local_1a0,auVar19);
        auVar1 = vcmpps_avx(auVar1,auVar21,1);
        auVar14 = vblendvps_avx(local_1a0,auVar21,auVar1);
        auVar1 = vandps_avx(local_180,auVar19);
        auVar1 = vcmpps_avx(auVar1,auVar21,1);
        auVar1 = vblendvps_avx(local_180,auVar21,auVar1);
        uVar13 = (ulong)(byte)(SUB161(auVar10 >> 7,0) & 1 | (SUB161(auVar10 >> 0xf,0) & 1) << 1 |
                               (SUB161(auVar10 >> 0x17,0) & 1) << 2 |
                               (SUB161(auVar10 >> 0x1f,0) & 1) << 3 |
                               (SUB161(auVar10 >> 0x27,0) & 1) << 4 |
                               (SUB161(auVar10 >> 0x2f,0) & 1) << 5 |
                               (SUB161(auVar10 >> 0x37,0) & 1) << 6 | SUB161(auVar10 >> 0x3f,0) << 7
                              );
        auVar11 = vrcpps_avx(auVar20);
        fVar2 = auVar11._0_4_;
        fVar3 = auVar11._4_4_;
        auVar12._4_4_ = auVar20._4_4_ * fVar3;
        auVar12._0_4_ = auVar20._0_4_ * fVar2;
        fVar4 = auVar11._8_4_;
        auVar12._8_4_ = auVar20._8_4_ * fVar4;
        fVar5 = auVar11._12_4_;
        auVar12._12_4_ = auVar20._12_4_ * fVar5;
        fVar6 = auVar11._16_4_;
        auVar12._16_4_ = auVar20._16_4_ * fVar6;
        fVar7 = auVar11._20_4_;
        auVar12._20_4_ = auVar20._20_4_ * fVar7;
        fVar8 = auVar11._24_4_;
        auVar12._24_4_ = auVar20._24_4_ * fVar8;
        auVar12._28_4_ = auVar20._28_4_;
        auVar16._8_4_ = 0x3f800000;
        auVar16._0_8_ = 0x3f8000003f800000;
        auVar16._12_4_ = 0x3f800000;
        auVar16._16_4_ = 0x3f800000;
        auVar16._20_4_ = 0x3f800000;
        auVar16._24_4_ = 0x3f800000;
        auVar16._28_4_ = 0x3f800000;
        auVar12 = vsubps_avx(auVar16,auVar12);
        auVar20 = vrcpps_avx(auVar14);
        local_160._0_4_ = fVar2 + fVar2 * auVar12._0_4_;
        local_160._4_4_ = fVar3 + fVar3 * auVar12._4_4_;
        local_160._8_4_ = fVar4 + fVar4 * auVar12._8_4_;
        local_160._12_4_ = fVar5 + fVar5 * auVar12._12_4_;
        local_160._16_4_ = fVar6 + fVar6 * auVar12._16_4_;
        local_160._20_4_ = fVar7 + fVar7 * auVar12._20_4_;
        local_160._24_4_ = fVar8 + fVar8 * auVar12._24_4_;
        local_160._28_4_ = auVar11._28_4_ + auVar12._28_4_;
        fVar2 = auVar20._0_4_;
        fVar3 = auVar20._4_4_;
        auVar11._4_4_ = auVar14._4_4_ * fVar3;
        auVar11._0_4_ = auVar14._0_4_ * fVar2;
        fVar4 = auVar20._8_4_;
        auVar11._8_4_ = auVar14._8_4_ * fVar4;
        fVar5 = auVar20._12_4_;
        auVar11._12_4_ = auVar14._12_4_ * fVar5;
        fVar6 = auVar20._16_4_;
        auVar11._16_4_ = auVar14._16_4_ * fVar6;
        fVar7 = auVar20._20_4_;
        auVar11._20_4_ = auVar14._20_4_ * fVar7;
        fVar8 = auVar20._24_4_;
        auVar11._24_4_ = auVar14._24_4_ * fVar8;
        auVar11._28_4_ = auVar14._28_4_;
        auVar11 = vsubps_avx(auVar16,auVar11);
        auVar14 = vrcpps_avx(auVar1);
        local_140._0_4_ = fVar2 + fVar2 * auVar11._0_4_;
        local_140._4_4_ = fVar3 + fVar3 * auVar11._4_4_;
        local_140._8_4_ = fVar4 + fVar4 * auVar11._8_4_;
        local_140._12_4_ = fVar5 + fVar5 * auVar11._12_4_;
        local_140._16_4_ = fVar6 + fVar6 * auVar11._16_4_;
        local_140._20_4_ = fVar7 + fVar7 * auVar11._20_4_;
        local_140._24_4_ = fVar8 + fVar8 * auVar11._24_4_;
        local_140._28_4_ = auVar20._28_4_ + auVar11._28_4_;
        fVar2 = auVar14._0_4_;
        fVar3 = auVar14._4_4_;
        auVar20._4_4_ = auVar1._4_4_ * fVar3;
        auVar20._0_4_ = auVar1._0_4_ * fVar2;
        fVar4 = auVar14._8_4_;
        auVar20._8_4_ = auVar1._8_4_ * fVar4;
        fVar5 = auVar14._12_4_;
        auVar20._12_4_ = auVar1._12_4_ * fVar5;
        fVar6 = auVar14._16_4_;
        auVar20._16_4_ = auVar1._16_4_ * fVar6;
        fVar7 = auVar14._20_4_;
        auVar20._20_4_ = auVar1._20_4_ * fVar7;
        fVar8 = auVar14._24_4_;
        auVar20._24_4_ = auVar1._24_4_ * fVar8;
        auVar20._28_4_ = auVar1._28_4_;
        auVar1 = vsubps_avx(auVar16,auVar20);
        local_120._0_4_ = fVar2 + fVar2 * auVar1._0_4_;
        local_120._4_4_ = fVar3 + fVar3 * auVar1._4_4_;
        local_120._8_4_ = fVar4 + fVar4 * auVar1._8_4_;
        local_120._12_4_ = fVar5 + fVar5 * auVar1._12_4_;
        local_120._16_4_ = fVar6 + fVar6 * auVar1._16_4_;
        local_120._20_4_ = fVar7 + fVar7 * auVar1._20_4_;
        local_120._24_4_ = fVar8 + fVar8 * auVar1._24_4_;
        local_120._28_4_ = auVar14._28_4_ + auVar1._28_4_;
        auVar20 = ZEXT1232(ZEXT412(0)) << 0x20;
        auVar1 = vcmpps_avx(local_160,auVar20,1);
        auVar22._8_4_ = 0x20;
        auVar22._0_8_ = 0x2000000020;
        auVar22._12_4_ = 0x20;
        auVar22._16_4_ = 0x20;
        auVar22._20_4_ = 0x20;
        auVar22._24_4_ = 0x20;
        auVar22._28_4_ = 0x20;
        local_100 = vandps_avx(auVar1,auVar22);
        auVar1 = vcmpps_avx(local_140,auVar20,5);
        auVar23._8_4_ = 0x40;
        auVar23._0_8_ = 0x4000000040;
        auVar23._12_4_ = 0x40;
        auVar23._16_4_ = 0x40;
        auVar23._20_4_ = 0x40;
        auVar23._24_4_ = 0x40;
        auVar23._28_4_ = 0x40;
        auVar25._8_4_ = 0x60;
        auVar25._0_8_ = 0x6000000060;
        auVar25._12_4_ = 0x60;
        auVar25._16_4_ = 0x60;
        auVar25._20_4_ = 0x60;
        auVar25._24_4_ = 0x60;
        auVar25._28_4_ = 0x60;
        local_e0 = vblendvps_avx(auVar25,auVar23,auVar1);
        auVar20 = ZEXT1232(ZEXT412(0)) << 0x20;
        auVar1 = vcmpps_avx(local_120,auVar20,5);
        auVar17._8_4_ = 0x80;
        auVar17._0_8_ = 0x8000000080;
        auVar17._12_4_ = 0x80;
        auVar17._16_4_ = 0x80;
        auVar17._20_4_ = 0x80;
        auVar17._24_4_ = 0x80;
        auVar17._28_4_ = 0x80;
        auVar24._8_4_ = 0xa0;
        auVar24._0_8_ = 0xa0000000a0;
        auVar24._12_4_ = 0xa0;
        auVar24._16_4_ = 0xa0;
        auVar24._20_4_ = 0xa0;
        auVar24._24_4_ = 0xa0;
        auVar24._28_4_ = 0xa0;
        local_c0 = vblendvps_avx(auVar24,auVar17,auVar1);
        auVar1 = vmaxps_avx(*(undefined1 (*) [32])(ray + 0x60),auVar20);
        auVar10 = vpmovsxwd_avx(auVar9);
        auVar9 = vpunpckhwd_avx(auVar9,auVar9);
        auVar14._16_16_ = auVar9;
        auVar14._0_16_ = auVar10;
        auVar18._8_4_ = 0x7f800000;
        auVar18._0_8_ = 0x7f8000007f800000;
        auVar18._12_4_ = 0x7f800000;
        auVar18._16_4_ = 0x7f800000;
        auVar18._20_4_ = 0x7f800000;
        auVar18._24_4_ = 0x7f800000;
        auVar18._28_4_ = 0x7f800000;
        local_a0 = vblendvps_avx(auVar18,auVar1,auVar14);
        auVar1 = vmaxps_avx(*(undefined1 (*) [32])(ray + 0x100),auVar20);
        auVar15._8_4_ = 0xff800000;
        auVar15._0_8_ = 0xff800000ff800000;
        auVar15._12_4_ = 0xff800000;
        auVar15._16_4_ = 0xff800000;
        auVar15._20_4_ = 0xff800000;
        auVar15._24_4_ = 0xff800000;
        auVar15._28_4_ = 0xff800000;
        local_80 = vblendvps_avx(auVar15,auVar1,auVar14);
        for (; uVar13 != 0; uVar13 = uVar13 & uVar13 - 1) {
          k = 0;
          if (uVar13 != 0) {
            for (; (uVar13 >> k & 1) == 0; k = k + 1) {
            }
          }
          intersect1(local_228,bvh,(NodeRef)(bvh->root).ptr,k,&local_231,local_230,
                     (TravRayK<8,_false> *)&local_220.field_0,context);
        }
      }
    }
    else {
      intersectCoherent(valid_i,This,ray,context);
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect(vint<K>* __restrict__ valid_i,
                                                                                               Accel::Intersectors* __restrict__ This,
                                                                                               RayHitK<K>& __restrict__ ray,
                                                                                               RayQueryContext* __restrict__ context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
            
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        intersectCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out invalid rays */
      vbool<K> valid = *valid_i == -1;
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      size_t valid_bits = movemask(valid);

#if defined(__AVX__)
      STAT3(normal.trav_hit_boxes[popcnt(movemask(valid))], 1, 1, 1);
#endif

      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      if (single)
      {
        tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
        tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));
        
        for (; valid_bits!=0; ) {
          const size_t i = bscf(valid_bits);
          intersect1(This, bvh, bvh->root, i, pre, ray, tray, context);
        }
        return;
      }

       /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      vint<K> octant = ray.octant();
      octant = select(valid, octant, vint<K>(0xffffffff));

      /* test whether we have ray with opposing direction signs in the packet */
      bool split = false;
      {
        size_t bits = valid_bits;
        vbool<K> vsplit( false );
        do
        {
          const size_t valid_index = bsf(bits);
          vbool<K> octant_valid = octant[valid_index] == octant;
          bits &= ~(size_t)movemask(octant_valid);
          vsplit |= vint<K>(octant[valid_index]) == (octant^vint<K>(0x7));
        } while (bits);
        if (any(vsplit)) split = true;
      }

      do
      {
        const size_t valid_index = bsf(valid_bits);
        const vint<K> diff_octant = vint<K>(octant[valid_index])^octant;
        const vint<K> count_diff_octant = \
          ((diff_octant >> 2) & 1) +
          ((diff_octant >> 1) & 1) +
          ((diff_octant >> 0) & 1);

        vbool<K> octant_valid = (count_diff_octant <= 1) & (octant != vint<K>(0xffffffff));
        if (!single || !split) octant_valid = valid; // deactivate octant sorting in pure chunk mode, otherwise instance traversal performance goes down 


        octant = select(octant_valid,vint<K>(0xffffffff),octant);
        valid_bits &= ~(size_t)movemask(octant_valid);

        tray.tnear = select(octant_valid, org_ray_tnear, vfloat<K>(pos_inf));
        tray.tfar  = select(octant_valid, org_ray_tfar , vfloat<K>(neg_inf));

        /* allocate stack and push root node */
        vfloat<K> stack_near[stackSizeChunk];
        NodeRef stack_node[stackSizeChunk];
        stack_node[0] = BVH::invalidNode;
        stack_near[0] = inf;
        stack_node[1] = bvh->root;
        stack_near[1] = tray.tnear;
        NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
        NodeRef* __restrict__ sptr_node = stack_node + 2;
        vfloat<K>* __restrict__ sptr_near = stack_near + 2;

        while (1) pop:
        {
          /* pop next node from stack */
          assert(sptr_node > stack_node);
          sptr_node--;
          sptr_near--;
          NodeRef cur = *sptr_node;
          if (unlikely(cur == BVH::invalidNode)) {
            assert(sptr_node == stack_node);
            break;
          }

          /* cull node if behind closest hit point */
          vfloat<K> curDist = *sptr_near;
          const vbool<K> active = curDist < tray.tfar;
          if (unlikely(none(active)))
            continue;

          /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
          if (single)
#endif
          {
            size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
            if (unlikely(popcnt(bits) <= switchThreshold))
#endif
            {
              for (; bits!=0; ) {
                const size_t i = bscf(bits);
                intersect1(This, bvh, cur, i, pre, ray, tray, context);
              }
              tray.tfar = min(tray.tfar, ray.tfar);
              continue;
            }
          }
#endif
          while (likely(!cur.isLeaf()))
          {
            /* process nodes */
            const vbool<K> valid_node = tray.tfar > curDist;
            STAT3(normal.trav_nodes, 1, popcnt(valid_node), K);
            const NodeRef nodeRef = cur;
            const BaseNode* __restrict__ const node = nodeRef.baseNode();

            /* set cur to invalid */
            cur = BVH::emptyNode;
            curDist = pos_inf;

            size_t num_child_hits = 0;

            for (unsigned i = 0; i < N; i++)
            {
              const NodeRef child = node->children[i];
              if (unlikely(child == BVH::emptyNode)) break;
              vfloat<K> lnearP;
              vbool<K> lhit = valid_node;
              BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

              /* if we hit the child we choose to continue with that child if it
                 is closer than the current next child, or we push it onto the stack */
              if (likely(any(lhit)))
              {                                
                assert(sptr_node < stackEnd);
                assert(child != BVH::emptyNode);
                const vfloat<K> childDist = select(lhit, lnearP, inf);
                /* push cur node onto stack and continue with hit child */
                if (any(childDist < curDist))
                {
                  if (likely(cur != BVH::emptyNode)) {
                    num_child_hits++;
                    *sptr_node = cur; sptr_node++;
                    *sptr_near = curDist; sptr_near++;
                  }
                  curDist = childDist;
                  cur = child;
                }

                /* push hit child onto stack */
                else {
                  num_child_hits++;                  
                  *sptr_node = child; sptr_node++;
                  *sptr_near = childDist; sptr_near++;
                }
              }
            }

#if defined(__AVX__)
            //STAT3(normal.trav_hit_boxes[num_child_hits], 1, 1, 1);
#endif

            if (unlikely(cur == BVH::emptyNode))
              goto pop;
            
            /* improved distance sorting for 3 or more hits */
            if (unlikely(num_child_hits >= 2))
            {
              if (any(sptr_near[-2] < sptr_near[-1]))
              {
                std::swap(sptr_near[-2],sptr_near[-1]);
                std::swap(sptr_node[-2],sptr_node[-1]);
              }
              if (unlikely(num_child_hits >= 3))
              {
                if (any(sptr_near[-3] < sptr_near[-1]))
                {
                  std::swap(sptr_near[-3],sptr_near[-1]);
                  std::swap(sptr_node[-3],sptr_node[-1]);
                }
                if (any(sptr_near[-3] < sptr_near[-2]))
                {
                  std::swap(sptr_near[-3],sptr_near[-2]);
                  std::swap(sptr_node[-3],sptr_node[-2]);
                }
              }
            }

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
            if (single)
            {
              // seems to be the best place for testing utilization
              if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
              {
                *sptr_node++ = cur;
                *sptr_near++ = curDist;
                goto pop;
              }
            }
#endif
          }

          /* return if stack is empty */
          if (unlikely(cur == BVH::invalidNode)) {
            assert(sptr_node == stack_node);
            break;
          }

          /* intersect leaf */
          assert(cur != BVH::emptyNode);
          const vbool<K> valid_leaf = tray.tfar > curDist;
          STAT3(normal.trav_leaves, 1, popcnt(valid_leaf), K);
          if (unlikely(none(valid_leaf))) continue;
          size_t items; const Primitive* prim = (Primitive*)cur.leaf(items);

          size_t lazy_node = 0;
          PrimitiveIntersectorK::intersect(valid_leaf, This, pre, ray, context, prim, items, tray, lazy_node);
          tray.tfar = select(valid_leaf, ray.tfar, tray.tfar);

          if (unlikely(lazy_node)) {
            *sptr_node = lazy_node; sptr_node++;
            *sptr_near = neg_inf;   sptr_near++;
          }
        }
      } while(valid_bits);
    }